

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O0

void __thiscall CommandLineParser::CommandLineParser(CommandLineParser *this,int argc,char **argv)

{
  char *__s;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string argument;
  int index;
  char **argv_local;
  int argc_local;
  CommandLineParser *this_local;
  
  this->_vptr_CommandLineParser = (_func_int **)&PTR__CommandLineParser_00114d20;
  this->m_useCompiler = false;
  this->m_useXml = false;
  std::__cxx11::string::string((string *)&this->m_xmlFileName);
  std::__cxx11::string::string((string *)&this->m_xsl);
  std::__cxx11::string::string((string *)&this->m_encoding);
  this->m_briefProgress = false;
  this->m_noProgress = false;
  this->m_useText = false;
  this->m_useCout = false;
  this->m_waitBeforeExit = false;
  std::__cxx11::string::string((string *)&this->m_testPath);
  std::deque<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>::deque(&this->m_plugIns)
  ;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&this->m_arguments);
  this->m_currentArgument = 0;
  std::__cxx11::string::string((string *)&this->m_option);
  for (argument.field_2._8_4_ = 1; (int)argument.field_2._8_4_ < argc;
      argument.field_2._8_4_ = argument.field_2._8_4_ + 1) {
    __s = argv[(int)argument.field_2._8_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_51);
    std::allocator<char>::~allocator(&local_51);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_arguments,(value_type *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

CommandLineParser::CommandLineParser( int argc, 
                                      const char *argv[] )
    : m_useCompiler( false )
    , m_useXml( false )
    , m_briefProgress( false )
    , m_noProgress( false )
    , m_useText( false )
    , m_useCout( false )
    , m_waitBeforeExit( false )
    , m_currentArgument( 0 )
{
  for ( int index =1; index < argc; ++index )
  {
    std::string argument( argv[index ] );
    m_arguments.push_back( argument );
  }
}